

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo_x86.c
# Opt level: O1

void FillX86BrandString(char *brand_string)

{
  uint *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  uVar4 = 0;
  puVar1 = (uint *)cpuid(0x80000000);
  uVar3 = *puVar1;
  if (uVar3 < 0x80000002) {
    uVar5 = 0;
  }
  else {
    puVar2 = (undefined8 *)cpuid_brand_part1_info(0x80000002);
    uVar4 = *puVar2;
    uVar5 = CONCAT44(*(undefined4 *)(puVar2 + 1),*(undefined4 *)((long)puVar2 + 0xc));
  }
  *(undefined8 *)brand_string = uVar4;
  *(undefined8 *)(brand_string + 8) = uVar5;
  uVar4 = 0;
  if (uVar3 < 0x80000003) {
    uVar5 = 0;
  }
  else {
    puVar2 = (undefined8 *)cpuid_brand_part2_info(0x80000003);
    uVar4 = *puVar2;
    uVar5 = CONCAT44(*(undefined4 *)(puVar2 + 1),*(undefined4 *)((long)puVar2 + 0xc));
  }
  *(undefined8 *)(brand_string + 0x10) = uVar4;
  *(undefined8 *)(brand_string + 0x18) = uVar5;
  uVar4 = 0;
  if (uVar3 < 0x80000004) {
    uVar5 = 0;
  }
  else {
    puVar2 = (undefined8 *)cpuid_brand_part3_info(0x80000004);
    uVar4 = *puVar2;
    uVar5 = CONCAT44(*(undefined4 *)(puVar2 + 1),*(undefined4 *)((long)puVar2 + 0xc));
  }
  *(undefined8 *)(brand_string + 0x20) = uVar4;
  *(undefined8 *)(brand_string + 0x28) = uVar5;
  brand_string[0x30] = '\0';
  return;
}

Assistant:

void FillX86BrandString(char brand_string[49]) {
  const Leaf leaf_ext_0 = CpuId(0x80000000);
  const uint32_t max_cpuid_leaf_ext = leaf_ext_0.eax;
  SetString(max_cpuid_leaf_ext, 0x80000002, brand_string);
  SetString(max_cpuid_leaf_ext, 0x80000003, brand_string + 16);
  SetString(max_cpuid_leaf_ext, 0x80000004, brand_string + 32);
  brand_string[48] = '\0';
}